

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O1

void __thiscall crnlib::task_pool::task_pool(task_pool *this,uint num_threads)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  char *in_RCX;
  long maximumCount;
  long maximumCount_00;
  
  spinlock::spinlock((spinlock *)this);
  lVar3 = 8;
  do {
    puVar1 = (undefined8 *)((long)&(this->m_task_stack).m_stack[0].m_data + lVar3 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m_task_stack).m_stack + lVar3 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x208);
  (this->m_task_stack).m_top = 0;
  this->m_num_threads = 0;
  semaphore::semaphore(&this->m_tasks_available,0,maximumCount,in_RCX);
  semaphore::semaphore(&this->m_all_tasks_completed,0,maximumCount_00,in_RCX);
  this->m_total_submitted_tasks = 0;
  this->m_total_completed_tasks = 0;
  this->m_exit_flag = 0;
  this->m_threads[0] = 0;
  this->m_threads[1] = 0;
  this->m_threads[2] = 0;
  this->m_threads[3] = 0;
  this->m_threads[4] = 0;
  this->m_threads[5] = 0;
  this->m_threads[6] = 0;
  this->m_threads[7] = 0;
  this->m_threads[8] = 0;
  this->m_threads[9] = 0;
  this->m_threads[10] = 0;
  this->m_threads[0xb] = 0;
  this->m_threads[0xc] = 0;
  this->m_threads[0xd] = 0;
  this->m_threads[0xe] = 0;
  this->m_threads[0xf] = 0;
  iVar2 = init(this,(EVP_PKEY_CTX *)(ulong)num_threads);
  if ((char)iVar2 == '\0') {
    crnlib_assert("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_threading_pthreads.cpp"
                  ,0x150);
  }
  return;
}

Assistant:

task_pool::task_pool(uint num_threads):
        m_num_threads(0),
        m_tasks_available(0, 32767),
        m_all_tasks_completed(0, 1),
        m_total_submitted_tasks(0),
        m_total_completed_tasks(0),
        m_exit_flag(false)
    {
        utils::zero_object(m_threads);

        bool status = init(num_threads);
        CRNLIB_VERIFY(status);
    }